

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::verifyImages
               (TestLog *log,TestContext *testCtx,RenderContext *renderCtx,
               ConstPixelBufferAccess *testImage,ConstPixelBufferAccess *referenceImage)

{
  TextureFormat TVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  int i_1;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ConstPixelBufferAccess *access;
  int iVar11;
  int iVar12;
  int iVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  uint uVar14;
  byte bVar15;
  long lVar16;
  uint uVar17;
  void *data;
  int iVar18;
  Vector<bool,_4> res_3;
  Vector<int,_4> res_1;
  int kYmax;
  int kYmin;
  IVec4 threshold;
  Surface diffMask;
  IVec4 cRef;
  IVec4 cTest;
  Vector<int,_4> res_2;
  undefined4 local_2c0;
  int local_2bc;
  string local_2b8;
  TextureFormat local_290;
  int local_288;
  int local_284;
  ulong local_280;
  undefined1 local_278 [40];
  ulong local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  string local_238;
  Surface local_210;
  undefined1 local_1f8 [24];
  ulong local_1e0;
  ConstPixelBufferAccess *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  local_290 = (TextureFormat)log;
  local_1f8._16_8_ = testCtx;
  tcu::Surface::Surface(&local_210,(testImage->m_size).m_data[0],(testImage->m_size).m_data[1]);
  local_1b8._0_4_ = RGBA;
  local_1b8._4_4_ = UNORM_INT8;
  data = (void *)local_210.m_pixels.m_cap;
  if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
    data = local_210.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_278,(TextureFormat *)local_1b8,local_210.m_width,
             local_210.m_height,1,data);
  local_250 = (ulong)(uint)(referenceImage->m_size).m_data[0];
  uVar14 = (referenceImage->m_size).m_data[1];
  iVar5 = (*renderCtx->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar15 = 8 - *(char *)(lVar7 + 8);
  lVar16 = 0;
  uVar6 = 0x1000000 << (8U - (char)*(int *)(lVar7 + 0x14) & 0x1f);
  if (*(int *)(lVar7 + 0x14) < 1) {
    uVar6 = 0;
  }
  uVar17 = 0x100 << (8U - *(char *)(lVar7 + 0xc) & 0x1f) | 1 << (bVar15 & 0x1f);
  uVar6 = 0x10000 << (8U - *(char *)(lVar7 + 0x10) & 0x1f) | uVar17 | uVar6;
  local_1b8._0_4_ = 0x80;
  local_1b8._4_4_ = 0x80;
  uStack_1b0 = (_func_int **)CONCAT44((uint)(0xffffff < uVar6) << 7,0x80);
  local_2b8._M_dataplus._M_p = (pointer)(CONCAT44(uVar17 >> 8,1 << (bVar15 & 0x1f)) & 0xff000000ff);
  local_2b8._M_string_length = CONCAT44(uVar6 >> 0x18,uVar6 >> 0x10) & 0xffffffff000000ff;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  do {
    *(int *)((long)&local_238._M_dataplus._M_p + lVar16 * 4) =
         *(int *)((long)&local_2b8._M_dataplus._M_p + lVar16 * 4) + *(int *)(local_1b8 + lVar16 * 4)
    ;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  tcu::clear((PixelBufferAccess *)local_278,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK
            );
  if ((int)uVar14 < 1) {
    local_2bc = -1;
    iVar5 = 0;
  }
  else {
    local_248 = uVar14 - 1;
    local_244 = (int)local_250 + -1;
    local_2bc = -1;
    uVar8 = 0;
    iVar5 = 0;
    local_1e0 = (ulong)uVar14;
    local_1d8 = testImage;
    do {
      if (0 < (int)(uint)local_250) {
        iVar11 = (int)uVar8;
        local_240 = 1;
        if (1 < iVar11) {
          local_240 = iVar11;
        }
        local_240 = local_240 + -1;
        local_284 = iVar11 + 1;
        if (local_248 <= iVar11 + 1) {
          local_284 = local_248;
        }
        uVar10 = 0;
        local_1d0 = uVar8;
        do {
          iVar11 = (int)uVar10;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1f8,(int)testImage,iVar11,(int)uVar8);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1c8,(int)referenceImage,iVar11,(int)uVar8);
          local_2b8._M_dataplus._M_p = (pointer)0x0;
          local_2b8._M_string_length = 0;
          lVar7 = 0;
          do {
            *(int *)((long)&local_2b8._M_dataplus._M_p + lVar7 * 4) =
                 *(int *)(local_1f8 + lVar7 * 4) - *(int *)(local_1c8 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_1b8._0_4_ = R;
          local_1b8._4_4_ = SNORM_INT8;
          uStack_1b0 = (_func_int **)0x0;
          lVar7 = 0;
          do {
            iVar18 = *(int *)((long)&local_2b8._M_dataplus._M_p + lVar7 * 4);
            iVar12 = -iVar18;
            if (0 < iVar18) {
              iVar12 = iVar18;
            }
            *(int *)(local_1b8 + lVar7 * 4) = iVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_2c0 = 0;
          lVar7 = 0;
          do {
            *(bool *)((long)&local_2c0 + lVar7) =
                 *(int *)(local_1b8 + lVar7 * 4) <=
                 *(int *)((long)&local_238._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_280 = uVar10;
          if ((char)local_2c0 == '\0') {
LAB_0127ef08:
            iVar18 = 1;
            if (1 < iVar11) {
              iVar18 = iVar11;
            }
            iVar12 = iVar11 + 1;
            if (local_244 <= iVar11 + 1) {
              iVar12 = local_244;
            }
            if (local_284 < local_240) {
              bVar3 = false;
            }
            else {
              local_23c = iVar18 + -1;
              bVar4 = false;
              bVar3 = false;
              iVar11 = local_23c;
              testImage = local_1d8;
              iVar18 = local_240;
              do {
                for (; local_288 = iVar5, local_1d8 = testImage, iVar11 <= iVar12;
                    iVar11 = iVar11 + 1) {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)local_1c8,(int)referenceImage,iVar11,iVar18);
                  local_2b8._M_dataplus._M_p = (pointer)0x0;
                  local_2b8._M_string_length = 0;
                  lVar7 = 0;
                  do {
                    *(int *)((long)&local_2b8._M_dataplus._M_p + lVar7 * 4) =
                         *(int *)(local_1f8 + lVar7 * 4) - *(int *)(local_1c8 + lVar7 * 4);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 4);
                  local_1b8._0_4_ = R;
                  local_1b8._4_4_ = SNORM_INT8;
                  uStack_1b0 = (_func_int **)0x0;
                  lVar7 = 0;
                  do {
                    iVar5 = *(int *)((long)&local_2b8._M_dataplus._M_p + lVar7 * 4);
                    iVar13 = -iVar5;
                    if (0 < iVar5) {
                      iVar13 = iVar5;
                    }
                    *(int *)(local_1b8 + lVar7 * 4) = iVar13;
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 4);
                  local_2c0 = 0;
                  lVar7 = 0;
                  do {
                    *(bool *)((long)&local_2c0 + lVar7) =
                         *(int *)(local_1b8 + lVar7 * 4) <=
                         *(int *)((long)&local_238._M_dataplus._M_p + lVar7 * 4);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 4);
                  if ((char)local_2c0 != '\0') {
                    uVar8 = 0xffffffffffffffff;
                    do {
                      if (uVar8 == 2) {
                        uVar10 = 3;
                        break;
                      }
                      uVar10 = uVar8 + 1;
                      lVar7 = uVar8 + 2;
                      uVar8 = uVar10;
                    } while (*(char *)((long)&local_2c0 + lVar7) != '\0');
                    bVar3 = bVar4;
                    if (2 < uVar10) {
                      bVar4 = true;
                      bVar3 = true;
                    }
                  }
                  iVar5 = local_288;
                  testImage = local_1d8;
                }
                iVar18 = iVar18 + 1;
                iVar11 = local_23c;
              } while (iVar18 <= local_284);
            }
            uVar8 = local_1d0;
            iVar18 = (int)local_1d0;
            if ((bVar3) &&
               (tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_278,
                           (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_DEV,(int)local_280,
                           iVar18,0), local_2bc == -1)) {
              local_2bc = 0;
            }
            iVar11 = (int)local_280;
            if (!bVar3) {
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_278,
                         (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,iVar11,iVar18,0)
              ;
              iVar5 = iVar5 + 1;
              local_2bc = 1;
            }
          }
          else {
            uVar10 = 0xffffffffffffffff;
            do {
              if (uVar10 == 2) {
                uVar9 = 3;
                break;
              }
              uVar9 = uVar10 + 1;
              lVar7 = uVar10 + 2;
              uVar10 = uVar9;
            } while (*(char *)((long)&local_2c0 + lVar7) != '\0');
            if (uVar9 < 3) goto LAB_0127ef08;
          }
          uVar10 = (ulong)(iVar11 + 1U);
        } while (iVar11 + 1U != (uint)local_250);
      }
      uVar14 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar14;
    } while (uVar14 != (uint)local_1e0);
  }
  local_1b8._0_4_ = local_290.order;
  local_1b8._4_4_ = local_290.type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0," faulty pixel(s) found.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (local_2bc != 1) {
    iVar5 = local_2bc;
  }
  if (0x14 < iVar5) {
    TVar1 = (TextureFormat)((long)local_278 + 0x10);
    local_278._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Images","");
    paVar2 = &local_2b8.field_2;
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Image comparison","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_1b8,(string *)local_278,&local_2b8);
    tcu::TestLog::startImageSet((TestLog *)local_290,(char *)local_1b8,local_198._M_p);
    local_288 = iVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_278._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Test image","");
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Test image","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_278,&local_2b8,testImage,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,local_290.order,__buf,(size_t)testImage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_278._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Reference image","");
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Reference image","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_278,&local_2b8,referenceImage,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,local_290.order,__buf_00,(size_t)referenceImage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Difference mask","");
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Difference mask","");
    local_1f8._0_4_ = RGBA;
    local_1f8._4_4_ = UNORM_INT8;
    if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
      local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_278,(TextureFormat *)local_1f8,local_210.m_width,
               local_210.m_height,1,(void *)local_210.m_pixels.m_cap);
    access = (ConstPixelBufferAccess *)local_278;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2b8,&local_238,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,local_290.order,__buf_01,(size_t)access);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    iVar5 = local_288;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endImageSet((TestLog *)local_290);
    local_1b8._0_4_ = local_290.order;
    local_1b8._4_4_ = local_290.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"Got ",4);
    std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    tcu::TestContext::setTestResult
              ((TestContext *)local_1f8._16_8_,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_210);
  return;
}

Assistant:

void verifyImages (tcu::TestLog& log, tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const tcu::ConstPixelBufferAccess& testImage, const tcu::ConstPixelBufferAccess& referenceImage)
{
	using tcu::TestLog;

	const int			kernelRadius		= 1;
	const int			faultyPixelLimit	= 20;
	int					faultyPixels;
	tcu::Surface		diffMask			(testImage.getWidth(), testImage.getHeight());

	faultyPixels = compareImages(log, renderCtx, referenceImage, testImage, diffMask.getAccess(), kernelRadius);

	if (faultyPixels > faultyPixelLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison");
		log << TestLog::Image("Test image", "Test image", testImage);
		log << TestLog::Image("Reference image", "Reference image", referenceImage);
		log << TestLog::Image("Difference mask", "Difference mask", diffMask.getAccess());
		log << TestLog::EndImageSet;

		log << tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}